

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgUpdateSequenceGrid
               (void *grid,int depth,char *sType,int *anisotropic_weights,int *limit_levels)

{
  TypeDepth TVar1;
  ostream *poVar2;
  allocator<char> local_59;
  string local_58;
  TypeDepth local_34;
  int *piStack_30;
  TypeDepth depth_type;
  int *limit_levels_local;
  int *anisotropic_weights_local;
  char *sType_local;
  TasmanianSparseGrid *pTStack_10;
  int depth_local;
  void *grid_local;
  
  piStack_30 = limit_levels;
  limit_levels_local = anisotropic_weights;
  anisotropic_weights_local = (int *)sType;
  sType_local._4_4_ = depth;
  pTStack_10 = (TasmanianSparseGrid *)grid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,sType,&local_59);
  TVar1 = TasGrid::IO::getDepthTypeString(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_34 = TVar1;
  if (TVar1 == type_none) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar2 = std::operator<<(poVar2,(char *)anisotropic_weights_local);
    poVar2 = std::operator<<(poVar2,", defaulting to type_iptotal.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (local_34 == type_none) {
    local_34 = type_iptotal;
  }
  TasGrid::TasmanianSparseGrid::updateSequenceGrid
            (pTStack_10,sType_local._4_4_,local_34,limit_levels_local,piStack_30);
  return;
}

Assistant:

void tsgUpdateSequenceGrid(void *grid, int depth, const char * sType, const int *anisotropic_weights, const int *limit_levels){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    #endif // NDEBUG
    if (depth_type == type_none){ depth_type = type_iptotal; }
    ((TasmanianSparseGrid*) grid)->updateSequenceGrid(depth, depth_type, anisotropic_weights, limit_levels);
}